

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::print(APInt *this,raw_ostream *OS,bool isSigned)

{
  SmallString<40U> S;
  
  S.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = &S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>
  ;
  S.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  S.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x28;
  toString(this,(SmallVectorImpl<char> *)&S,10,isSigned,false);
  raw_ostream::operator<<(OS,(SmallVectorImpl<char> *)&S);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&S);
  return;
}

Assistant:

void APInt::print(raw_ostream &OS, bool isSigned) const {
  SmallString<40> S;
  this->toString(S, 10, isSigned, /* formatAsCLiteral = */false);
  OS << S;
}